

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table-utils.cpp
# Opt level: O0

bool wasm::TableUtils::usesExpressions(ElementSegment *curr,Module *module)

{
  bool bVar1;
  vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
  *this;
  bool local_49;
  HeapType local_48;
  Type local_40 [2];
  bool hasSpecializedType;
  iterator iStack_30;
  Expression **local_28;
  byte local_19;
  Module *pMStack_18;
  bool allElementsRefFunc;
  Module *module_local;
  ElementSegment *curr_local;
  
  pMStack_18 = module;
  module_local = (Module *)curr;
  local_28 = (Expression **)
             std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::begin
                       (&curr->data);
  iStack_30 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::end
                        ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                         &(module_local->globals).
                          super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
  local_19 = std::
             all_of<__gnu_cxx::__normal_iterator<wasm::Expression**,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>,wasm::TableUtils::usesExpressions(wasm::ElementSegment*,wasm::Module*)::__0>
                       (local_28,iStack_30._M_current);
  this = &module_local->globals;
  HeapType::HeapType(&local_48,func);
  wasm::Type::Type(local_40,local_48,Nullable,Inexact);
  bVar1 = wasm::Type::operator!=((Type *)this,local_40);
  local_49 = true;
  if ((local_19 & 1) != 0) {
    local_49 = bVar1;
  }
  return local_49;
}

Assistant:

bool usesExpressions(ElementSegment* curr, Module* module) {
  // Binaryen IR always has ref.funcs for functions in tables for uniformity,
  // so that by itself does not indicate if expressions should be used when
  // emitting the table or not. But definitely anything that is not a ref.func
  // implies we are post-MVP and must use expressions.
  bool allElementsRefFunc =
    std::all_of(curr->data.begin(), curr->data.end(), [](Expression* entry) {
      return entry->is<RefFunc>();
    });

  // If the segment has a specialized (non-MVP) type, then it must use the
  // post-MVP form of using expressions.
  bool hasSpecializedType = curr->type != Type(HeapType::func, Nullable);

  return !allElementsRefFunc || hasSpecializedType;
}